

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMappedFile.cpp
# Opt level: O2

bool aeron::util::MemoryMappedFile::fill(FileHandle fd,size_t size,uint8_t value)

{
  ulong uVar1;
  undefined7 in_register_00000011;
  bool bVar2;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> buffer;
  _Head_base<0UL,_unsigned_char_*,_false> local_30;
  
  uVar1 = m_page_size;
  local_30._M_head_impl = (uchar *)operator_new__(m_page_size);
  memset(local_30._M_head_impl,(int)CONCAT71(in_register_00000011,value),uVar1);
  for (; uVar1 <= size; size = size - uVar1) {
    uVar1 = write(fd.handle,local_30._M_head_impl,uVar1);
    if (uVar1 != m_page_size) goto LAB_001527f9;
  }
  if (size != 0) {
    uVar1 = write(fd.handle,local_30._M_head_impl,size);
    if (uVar1 != size) {
LAB_001527f9:
      bVar2 = false;
      goto LAB_001527fb;
    }
  }
  bVar2 = true;
LAB_001527fb:
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_30);
  return bVar2;
}

Assistant:

bool MemoryMappedFile::fill(FileHandle fd, size_t size, uint8_t value)
{
    std::unique_ptr<uint8_t[]> buffer(new uint8_t[m_page_size]);
    memset(buffer.get(), value, m_page_size);

    while (size >= m_page_size)
    {
        if (static_cast<size_t>(write(fd.handle, buffer.get(), m_page_size)) != m_page_size)
        {
            return false;
        }

        size -= m_page_size;
    }

    if (size)
    {
        if (static_cast<size_t>(write(fd.handle, buffer.get(), size)) != size)
        {
            return false;
        }
    }
    return true;
}